

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.h
# Opt level: O0

void __thiscall
Catch::StreamingReporterBase<Catch::CompactReporter>::testGroupEnded
          (StreamingReporterBase<Catch::CompactReporter> *this,TestGroupStats *param_1)

{
  TestGroupStats *param_1_local;
  StreamingReporterBase<Catch::CompactReporter> *this_local;
  
  LazyStat<Catch::GroupInfo>::reset(&this->currentGroupInfo);
  return;
}

Assistant:

void testGroupEnded(TestGroupStats const& /* _testGroupStats */) override {
            currentGroupInfo.reset();
        }